

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

bool __thiscall nigel::AstExpr::isTypeCondition(AstExpr *this)

{
  bool local_11;
  AstExpr *this_local;
  
  local_11 = true;
  if ((((this->type != booleanParenthesis) && (local_11 = true, this->type != keywordCondition)) &&
      (local_11 = true, this->type != arithmenticCondition)) &&
     (local_11 = true, this->type != comparisonCondition)) {
    local_11 = this->type == combinationCondition;
  }
  return local_11;
}

Assistant:

bool isTypeCondition() { return type == Type::booleanParenthesis || type == Type::keywordCondition || type == Type::arithmenticCondition || type == Type::comparisonCondition || type == Type::combinationCondition; }